

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
ztimer::TimerManager::TimePointValid
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,TimerManager *this,
          string *timePoint)

{
  int iVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  pointer piVar2;
  bool bVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  value_type_conflict2 *__val;
  regex rule;
  undefined1 local_78 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  pointer local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  if (timePoint->_M_string_length != 0x13) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,
             "^\\d{4}-((0[1-9])|(1[0-2]))-((0[1-9])|([1-2]\\d)|(3[0-1])) (([0-1]\\d)|(2[0-3]))(:[0-5]\\d){2}$"
             ,0x10);
  __s._M_current = (timePoint->_M_dataplus)._M_p;
  local_78._16_8_ = (pointer)0x0;
  _Stack_60._M_current = (char *)0x0;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  bVar3 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + timePoint->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78,&local_50,0);
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (!bVar3) {
LAB_0011c650:
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
    return __return_storage_ptr__;
  }
  piVar4 = (int *)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar4;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar4;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar4 + 6;
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  piVar4[4] = 0;
  piVar4[5] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar4 + 6;
  std::__cxx11::string::substr((ulong)local_78,(ulong)timePoint);
  uVar7 = local_78._0_8_;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol((char *)uVar7,(char **)&local_58,10);
  if (local_58 == (pointer)uVar7) {
    std::__throw_invalid_argument("stoi");
LAB_0011c688:
    std::__throw_out_of_range("stoi");
LAB_0011c694:
    std::__throw_invalid_argument("stoi");
LAB_0011c6a0:
    std::__throw_out_of_range("stoi");
LAB_0011c6ac:
    std::__throw_invalid_argument("stoi");
LAB_0011c6b8:
    std::__throw_out_of_range("stoi");
LAB_0011c6c4:
    std::__throw_invalid_argument("stoi");
LAB_0011c6d0:
    std::__throw_out_of_range("stoi");
LAB_0011c6dc:
    std::__throw_invalid_argument("stoi");
LAB_0011c6e8:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) goto LAB_0011c688;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    *piVar4 = (int)lVar6;
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_78._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)timePoint);
    uVar7 = local_78._0_8_;
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)local_78._0_8_,(char **)&local_58,10);
    if (local_58 == (pointer)uVar7) goto LAB_0011c694;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_0011c6a0;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    piVar4[1] = (int)lVar6;
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_78._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)timePoint);
    uVar7 = local_78._0_8_;
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)local_78._0_8_,(char **)&local_58,10);
    if (local_58 == (pointer)uVar7) goto LAB_0011c6ac;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_0011c6b8;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    piVar4[2] = (int)lVar6;
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_78._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)timePoint);
    uVar7 = local_78._0_8_;
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)local_78._0_8_,(char **)&local_58,10);
    if (local_58 == (pointer)uVar7) goto LAB_0011c6c4;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_0011c6d0;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    piVar4[3] = (int)lVar6;
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_78._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)timePoint);
    uVar7 = local_78._0_8_;
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)local_78._0_8_,(char **)&local_58,10);
    if (local_58 == (pointer)uVar7) goto LAB_0011c6dc;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_0011c6e8;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    piVar4[4] = (int)lVar6;
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_78._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_78,(ulong)timePoint);
    uVar7 = local_78._0_8_;
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)local_78._0_8_,(char **)&local_58,10);
    if (local_58 != (pointer)uVar7) {
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[5] = (int)lVar6;
        if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,
                          (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_78._16_8_)->first)._M_current + 1));
        }
        goto LAB_0011c650;
      }
      goto LAB_0011c700;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011c700:
  uVar7 = std::__throw_out_of_range("stoi");
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(__return_storage_ptr__->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  _Unwind_Resume(uVar7);
}

Assistant:

std::vector<int> TimerManager::TimePointValid(const std::string& timePoint)
    {
        // 合法的系统时间点： char timePoint[20] = "xxxx-xx-xx xx:xx:xx";
        if (timePoint.size() != 19) {
            return {};
        }
        std::regex rule(
            "^\\d{4}-((0[1-9])|(1[0-2]))-((0[1-9])|([1-2]\\d)|(3[0-1])) (([0-1]\\d)|(2[0-3]))(:[0-5]\\d){2}$");
        if (regex_match(timePoint, rule) == false) {
            return {};
        }
        std::vector<int> ans(6);
        ans[0] = std::stoi(timePoint.substr(0, 4));   // year
        ans[1] = std::stoi(timePoint.substr(5, 2));   // month
        ans[2] = std::stoi(timePoint.substr(8, 2));   // day
        ans[3] = std::stoi(timePoint.substr(11, 2));  // hour
        ans[4] = std::stoi(timePoint.substr(14, 2));  // minute
        ans[5] = std::stoi(timePoint.substr(17, 2));  // second
        return ans;
    }